

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Nullability __thiscall
wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,Nullability nullability)

{
  uint32_t uVar1;
  Nullability NVar2;
  
  NVar2 = Nullable;
  if ((nullability != Nullable) && (((byte)this->wasm[0x179] & 4) != 0)) {
    uVar1 = Random::upTo(&this->random,2);
    if (uVar1 == 0) {
      NVar2 = NonNullable;
    }
  }
  return NVar2;
}

Assistant:

Nullability TranslateToFuzzReader::getSuperType(Nullability nullability) {
  if (nullability == Nullable) {
    return Nullable;
  }
  return getNullability();
}